

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageReadWrite
          (ValidationState_t *_,Instruction *inst,ImageTypeInfo *info)

{
  bool bVar1;
  DiagnosticStream *pDVar2;
  DiagnosticStream local_b38;
  DiagnosticStream local_960;
  DiagnosticStream local_788;
  DiagnosticStream local_5b0;
  DiagnosticStream local_3d8;
  DiagnosticStream local_200;
  ImageTypeInfo *local_28;
  ImageTypeInfo *info_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_28 = info;
  info_local = (ImageTypeInfo *)inst;
  inst_local = (Instruction *)_;
  if (info->sampled == 2) {
    if ((info->dim == Dim1D) && (bVar1 = ValidationState_t::HasCapability(_,Image1D), !bVar1)) {
      ValidationState_t::diag
                (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 (Instruction *)info_local);
      pDVar2 = DiagnosticStream::operator<<
                         (&local_200,
                          (char (*) [55])"Capability Image1D is required to access storage image");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
      DiagnosticStream::~DiagnosticStream(&local_200);
      return __local._4_4_;
    }
    if ((local_28->dim == Rect) &&
       (bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,ImageRect), !bVar1)
       ) {
      ValidationState_t::diag
                (&local_3d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 (Instruction *)info_local);
      pDVar2 = DiagnosticStream::operator<<
                         (&local_3d8,
                          (char (*) [57])"Capability ImageRect is required to access storage image")
      ;
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
      DiagnosticStream::~DiagnosticStream(&local_3d8);
      return __local._4_4_;
    }
    if ((local_28->dim == Buffer) &&
       (bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,ImageBuffer),
       !bVar1)) {
      ValidationState_t::diag
                (&local_5b0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 (Instruction *)info_local);
      pDVar2 = DiagnosticStream::operator<<
                         (&local_5b0,
                          (char (*) [59])
                          "Capability ImageBuffer is required to access storage image");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
      DiagnosticStream::~DiagnosticStream(&local_5b0);
      return __local._4_4_;
    }
    if (((local_28->dim == Cube) && (local_28->arrayed == 1)) &&
       (bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,ImageCubeArray),
       !bVar1)) {
      ValidationState_t::diag
                (&local_788,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 (Instruction *)info_local);
      pDVar2 = DiagnosticStream::operator<<
                         (&local_788,
                          (char (*) [49])"Capability ImageCubeArray is required to access ");
      pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [14])0x62d43d);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
      DiagnosticStream::~DiagnosticStream(&local_788);
      return __local._4_4_;
    }
    if (((local_28->multisampled == 1) && (local_28->arrayed == 1)) &&
       ((local_28->sampled == 2 &&
        (bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,ImageMSArray),
        !bVar1)))) {
      ValidationState_t::diag
                (&local_960,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 (Instruction *)info_local);
      pDVar2 = DiagnosticStream::operator<<
                         (&local_960,
                          (char (*) [55])"Capability ImageMSArray is required to access storage ");
      pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [6])0x62c63c);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
      DiagnosticStream::~DiagnosticStream(&local_960);
      return __local._4_4_;
    }
  }
  else if (info->sampled != 0) {
    ValidationState_t::diag(&local_b38,_,SPV_ERROR_INVALID_DATA,inst);
    pDVar2 = DiagnosticStream::operator<<
                       (&local_b38,
                        (char (*) [48])"Expected Image \'Sampled\' parameter to be 0 or 2");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
    DiagnosticStream::~DiagnosticStream(&local_b38);
    return __local._4_4_;
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateImageReadWrite(ValidationState_t& _,
                                    const Instruction* inst,
                                    const ImageTypeInfo& info) {
  if (info.sampled == 2) {
    if (info.dim == spv::Dim::Dim1D &&
        !_.HasCapability(spv::Capability::Image1D)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability Image1D is required to access storage image";
    } else if (info.dim == spv::Dim::Rect &&
               !_.HasCapability(spv::Capability::ImageRect)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability ImageRect is required to access storage image";
    } else if (info.dim == spv::Dim::Buffer &&
               !_.HasCapability(spv::Capability::ImageBuffer)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability ImageBuffer is required to access storage image";
    } else if (info.dim == spv::Dim::Cube && info.arrayed == 1 &&
               !_.HasCapability(spv::Capability::ImageCubeArray)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability ImageCubeArray is required to access "
             << "storage image";
    }

    if (info.multisampled == 1 && info.arrayed == 1 && info.sampled == 2 &&
        !_.HasCapability(spv::Capability::ImageMSArray)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability ImageMSArray is required to access storage "
             << "image";
    }
  } else if (info.sampled != 0) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Image 'Sampled' parameter to be 0 or 2";
  }

  return SPV_SUCCESS;
}